

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_parse_function_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::ParseFunctionGenerator::GenerateTailCallTable
          (ParseFunctionGenerator *this,Formatter *format)

{
  Formatter *pFVar1;
  bool bVar2;
  FileOptions_OptimizeMode FVar3;
  int iVar4;
  LogMessage *other;
  pointer pTVar5;
  FileDescriptor *file;
  ExtensionRange *args;
  ExtensionRange *pEVar6;
  Options *options;
  undefined1 local_148 [8];
  ScopedIndenter fast_scope;
  uint local_120;
  int local_11c;
  undefined1 local_118 [8];
  ScopedIndenter header_scope;
  ScopedIndenter table_scope;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [8];
  string fallback;
  LogMessage local_50;
  Formatter *local_18;
  Formatter *format_local;
  ParseFunctionGenerator *this_local;
  
  local_18 = format;
  format_local = (Formatter *)this;
  bVar2 = should_generate_tctable(this);
  if (!bVar2) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_parse_function_generator.cc"
               ,0x21d);
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: should_generate_tctable(): ");
    internal::LogFinisher::operator=((LogFinisher *)(fallback.field_2._M_local_buf + 0xb),other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  std::__cxx11::string::string((string *)local_88);
  pTVar5 = std::
           unique_ptr<google::protobuf::compiler::cpp::TailCallTableInfo,_std::default_delete<google::protobuf::compiler::cpp::TailCallTableInfo>_>
           ::operator->(&this->tc_table_info_);
  if ((pTVar5->use_generated_fallback & 1U) == 0) {
    (anonymous_namespace)::TcParserName_abi_cxx11_
              ((string *)&table_scope,(_anonymous_namespace_ *)this->options_,options);
    std::operator+(&local_e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&table_scope
                   ,"GenericFallback");
    std::__cxx11::string::operator=((string *)local_88,(string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&table_scope);
    file = Descriptor::file(this->descriptor_);
    FVar3 = GetOptimizeFor(file,this->options_);
    if (FVar3 == FileOptions_OptimizeMode_LITE_RUNTIME) {
      std::__cxx11::string::operator+=((string *)local_88,"Lite");
    }
  }
  else {
    ClassName_abi_cxx11_(&local_c8,(cpp *)this->descriptor_,(Descriptor *)options);
    std::operator+(&local_a8,&local_c8,"::Tct_ParseFallback");
    std::__cxx11::string::operator=((string *)local_88,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  pFVar1 = local_18;
  pTVar5 = std::
           unique_ptr<google::protobuf::compiler::cpp::TailCallTableInfo,_std::default_delete<google::protobuf::compiler::cpp::TailCallTableInfo>_>
           ::operator->(&this->tc_table_info_);
  Formatter::operator()
            (pFVar1,
             "const ::$proto_ns$::internal::TcParseTable<$1$>\n    $classname$::_table_ = {\n",
             &pTVar5->table_size_log2);
  Formatter::ScopedIndent((Formatter *)&header_scope);
  Formatter::operator()<>(local_18,"{\n");
  Formatter::ScopedIndent((Formatter *)local_118);
  if ((0 < this->num_hasbits_) || (bVar2 = IsMapEntryMessage(this->descriptor_), bVar2)) {
    Formatter::operator()<>(local_18,"PROTOBUF_FIELD_OFFSET($classname$, _has_bits_),\n");
  }
  else {
    Formatter::operator()<>(local_18,"0,  // no _has_bits_\n");
  }
  iVar4 = Descriptor::extension_range_count(this->descriptor_);
  pFVar1 = local_18;
  if (iVar4 == 1) {
    args = Descriptor::extension_range(this->descriptor_,0);
    pEVar6 = Descriptor::extension_range(this->descriptor_,0);
    Formatter::operator()
              (pFVar1,
               "PROTOBUF_FIELD_OFFSET($classname$, _extensions_),\n$1$, $2$,  // extension_range_{low,high}\n"
               ,&args->start,&pEVar6->end);
  }
  else {
    Formatter::operator()<>(local_18,"0, 0, 0,  // no _extensions_\n");
  }
  pFVar1 = local_18;
  pTVar5 = std::
           unique_ptr<google::protobuf::compiler::cpp::TailCallTableInfo,_std::default_delete<google::protobuf::compiler::cpp::TailCallTableInfo>_>
           ::operator->(&this->tc_table_info_);
  local_11c = (1 << ((byte)pTVar5->table_size_log2 & 0x1f)) * 8 + -8;
  local_120 = Descriptor::field_count(this->descriptor_);
  DefaultInstanceName_abi_cxx11_
            ((string *)&fast_scope,(cpp *)this->descriptor_,(Descriptor *)this->options_,
             (Options *)(ulong)local_120);
  Formatter::operator()
            (pFVar1,
             "$1$, 0, $2$,  // fast_idx_mask, reserved, num_fields\n&$3$._instance,\n$4$  // fallback\n"
             ,&local_11c,(int *)&local_120,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fast_scope,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
  std::__cxx11::string::~string((string *)&fast_scope);
  Formatter::ScopedIndenter::~ScopedIndenter((ScopedIndenter *)local_118);
  Formatter::operator()<>(local_18,"}, {\n");
  Formatter::ScopedIndent((Formatter *)local_148);
  GenerateFastFieldEntries(this,local_18,(string *)local_88);
  Formatter::ScopedIndenter::~ScopedIndenter((ScopedIndenter *)local_148);
  Formatter::operator()<>(local_18,"},\n");
  Formatter::ScopedIndenter::~ScopedIndenter(&header_scope);
  Formatter::operator()<>(local_18,"};\n\n");
  std::__cxx11::string::~string((string *)local_88);
  return;
}

Assistant:

void ParseFunctionGenerator::GenerateTailCallTable(Formatter& format) {
  GOOGLE_CHECK(should_generate_tctable());
  // All entries without a fast-path parsing function need a fallback.
  std::string fallback;
  if (tc_table_info_->use_generated_fallback) {
    fallback = ClassName(descriptor_) + "::Tct_ParseFallback";
  } else {
    fallback = TcParserName(options_) + "GenericFallback";
    if (GetOptimizeFor(descriptor_->file(), options_) ==
        FileOptions::LITE_RUNTIME) {
      fallback += "Lite";
    }
  }

  // For simplicity and speed, the table is not covering all proto
  // configurations. This model uses a fallback to cover all situations that
  // the table can't accommodate, together with unknown fields or extensions.
  // These are number of fields over 32, fields with 3 or more tag bytes,
  // maps, weak fields, lazy, more than 1 extension range. In the cases
  // the table is sufficient we can use a generic routine, that just handles
  // unknown fields and potentially an extension range.
  format(
      "const ::$proto_ns$::internal::TcParseTable<$1$>\n"
      "    $classname$::_table_ = {\n",
      tc_table_info_->table_size_log2);
  {
    auto table_scope = format.ScopedIndent();
    format("{\n");
    {
      auto header_scope = format.ScopedIndent();
      if (num_hasbits_ > 0 || IsMapEntryMessage(descriptor_)) {
        format("PROTOBUF_FIELD_OFFSET($classname$, _has_bits_),\n");
      } else {
        format("0,  // no _has_bits_\n");
      }
      if (descriptor_->extension_range_count() == 1) {
        format(
            "PROTOBUF_FIELD_OFFSET($classname$, _extensions_),\n"
            "$1$, $2$,  // extension_range_{low,high}\n",
            descriptor_->extension_range(0)->start,
            descriptor_->extension_range(0)->end);
      } else {
        format("0, 0, 0,  // no _extensions_\n");
      }
      format(
          "$1$, 0, $2$,  // fast_idx_mask, reserved, num_fields\n"
          "&$3$._instance,\n"
          "$4$  // fallback\n",
          (((1 << tc_table_info_->table_size_log2) - 1) << 3),
          descriptor_->field_count(),
          DefaultInstanceName(descriptor_, options_), fallback);
    }
    format("}, {\n");
    {
      auto fast_scope = format.ScopedIndent();
      GenerateFastFieldEntries(format, fallback);
    }
    format("},\n");  // entries[]
  }
  format("};\n\n");  // _table_
}